

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable.hpp
# Opt level: O2

int __thiscall
wigwag::
listenable<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex>
::connect(listenable<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined8 uVar1;
  undefined4 in_register_00000034;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  uVar1 = *(undefined8 *)CONCAT44(in_register_00000034,__fd);
  local_28._0_2_ = __addr->sa_family;
  local_28[2] = __addr->sa_data[0];
  local_28[3] = __addr->sa_data[1];
  local_28[4] = __addr->sa_data[2];
  local_28[5] = __addr->sa_data[3];
  local_28[6] = __addr->sa_data[4];
  local_28[7] = __addr->sa_data[5];
  a_Stack_20[0]._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__addr->sa_data + 6);
  __addr->sa_data[6] = '\0';
  __addr->sa_data[7] = '\0';
  __addr->sa_data[8] = '\0';
  __addr->sa_data[9] = '\0';
  __addr->sa_data[10] = '\0';
  __addr->sa_data[0xb] = '\0';
  __addr->sa_data[0xc] = '\0';
  __addr->sa_data[0xd] = '\0';
  __addr->sa_family = 0;
  __addr->sa_data[0] = '\0';
  __addr->sa_data[1] = '\0';
  __addr->sa_data[2] = '\0';
  __addr->sa_data[3] = '\0';
  __addr->sa_data[4] = '\0';
  __addr->sa_data[5] = '\0';
  detail::
  listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  ::connect((listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
             *)this,(int)uVar1,(sockaddr *)local_28,__len);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  return (int)this;
}

Assistant:

token connect(ListenerType_ handler, handler_attributes attributes = handler_attributes::none) const
        { return _impl->connect(std::move(handler), attributes); }